

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

void __thiscall QToolButton::setMenu(QToolButton *this,QMenu *menu)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  QAction *pQVar5;
  undefined8 uVar6;
  QAction *pQVar7;
  
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  plVar1 = (long *)(lVar2 + 0x2c8);
  if (menu == (QMenu *)0x0) {
    pQVar5 = (QAction *)0x0;
  }
  else {
    pQVar5 = QMenu::menuAction(menu);
  }
  lVar3 = *plVar1;
  if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
    pQVar7 = (QAction *)0x0;
  }
  else {
    pQVar7 = *(QAction **)(lVar2 + 0x2d0);
  }
  if (pQVar7 != pQVar5) {
    if (((lVar3 != 0) && (*(int *)(lVar3 + 4) != 0)) && (*(long *)(lVar2 + 0x2d0) != 0)) {
      if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
        pQVar5 = (QAction *)0x0;
      }
      else {
        pQVar5 = *(QAction **)(lVar2 + 0x2d0);
      }
      QWidget::removeAction((QWidget *)this,pQVar5);
    }
    if (menu == (QMenu *)0x0) {
      piVar4 = (int *)*plVar1;
      *plVar1 = 0;
      *(undefined8 *)(lVar2 + 0x2d0) = 0;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          operator_delete(piVar4);
        }
      }
    }
    else {
      pQVar5 = QMenu::menuAction(menu);
      if (pQVar5 == (QAction *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar5);
      }
      piVar4 = *(int **)(lVar2 + 0x2c8);
      *(undefined8 *)(lVar2 + 0x2c8) = uVar6;
      *(QAction **)(lVar2 + 0x2d0) = pQVar5;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          operator_delete(piVar4);
        }
      }
      if ((*plVar1 == 0) || (*(int *)(*plVar1 + 4) == 0)) {
        pQVar5 = (QAction *)0x0;
      }
      else {
        pQVar5 = *(QAction **)(lVar2 + 0x2d0);
      }
      QWidget::addAction((QWidget *)this,pQVar5);
    }
    *(undefined8 *)(lVar2 + 0x2ac) = 0xffffffffffffffff;
    QWidget::updateGeometry((QWidget *)this);
    QWidget::update((QWidget *)this);
    return;
  }
  return;
}

Assistant:

void QToolButton::setMenu(QMenu* menu)
{
    Q_D(QToolButton);

    if (d->menuAction == (menu ? menu->menuAction() : nullptr))
        return;

    if (d->menuAction)
        removeAction(d->menuAction);

    if (menu) {
        d->menuAction = menu->menuAction();
        addAction(d->menuAction);
    } else {
        d->menuAction = nullptr;
    }

    // changing the menu set may change the size hint, so reset it
    d->sizeHint = QSize();
    updateGeometry();
    update();
}